

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse(parser_t<comments_skipper_t> *this)

{
  istream *piVar1;
  
  events_aggregator_t::start_document(&this->handler->super_events_aggregator_t);
  while( true ) {
    parse_expression(this);
    piVar1 = (this->input).m_backend;
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 2) != 0) break;
    parse_new_line(this);
  }
  events_aggregator_t::finish_document(&this->handler->super_events_aggregator_t);
  return;
}

Assistant:

void parse() {
        handler.start_document();

        parse_expression();

        while (!input.eof()) {
            parse_new_line();
            parse_expression();
        }

        handler.finish_document();
    }